

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O2

DdNode * selectMintermsFromUniverse(DdManager *manager,int *varSeen,double n)

{
  int *piVar1;
  uint uVar2;
  DdNode **vars;
  DdNode *pDVar3;
  DdNode *pDVar4;
  uint numVars;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  
  pDVar4 = manager->one;
  numVars = 0;
  uVar7 = manager->size - 1;
  for (uVar2 = uVar7; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    numVars = numVars + (varSeen[uVar2] == 0);
  }
  vars = (DdNode **)malloc((ulong)numVars * 8);
  if (vars == (DdNode **)0x0) {
    manager->errorCode = CUDD_MEMORY_OUT;
    pDVar4 = (DdNode *)0x0;
  }
  else {
    iVar5 = 0;
    for (; -1 < (int)uVar7; uVar7 = uVar7 - 1) {
      if (varSeen[uVar7] == 0) {
        pDVar3 = cuddUniqueInter(manager,manager->perm[uVar7],pDVar4,(DdNode *)((ulong)pDVar4 ^ 1));
        vars[iVar5] = pDVar3;
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        iVar5 = iVar5 + 1;
      }
    }
    pDVar4 = mintermsFromUniverse(manager,vars,numVars,n,0);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
    for (uVar6 = 0; numVars != uVar6; uVar6 = uVar6 + 1) {
      Cudd_RecursiveDeref(manager,vars[uVar6]);
    }
    free(vars);
  }
  return pDVar4;
}

Assistant:

static DdNode *
selectMintermsFromUniverse(
  DdManager * manager,
  int * varSeen,
  double  n)
{
    int numVars;
    int i, size, j;
     DdNode *one, *zero, *result;
    DdNode **vars;

    numVars = 0;
    size = manager->size;
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Count the number of variables not encountered so far in procedure
    ** cuddSplitSetRecur.
    */
    for (i = size-1; i >= 0; i--) {
        if(varSeen[i] == 0)
            numVars++;
    }
    vars = ABC_ALLOC(DdNode *, numVars);
    if (!vars) {
        manager->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    j = 0;
    for (i = size-1; i >= 0; i--) {
        if(varSeen[i] == 0) {
            vars[j] = cuddUniqueInter(manager,manager->perm[i],one,zero);
            cuddRef(vars[j]);
            j++;
        }
    }

    /* Compute a function which has n minterms and depends on at most
    ** numVars variables.
    */
    result = mintermsFromUniverse(manager,vars,numVars,n, 0);
    if (result) 
        cuddRef(result);

    for (i = 0; i < numVars; i++)
        Cudd_RecursiveDeref(manager,vars[i]);
    ABC_FREE(vars);

    return(result);

}